

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Promise<bool> __thiscall
kj::anon_unknown_36::HttpInputStreamImpl::awaitNextMessage(HttpInputStreamImpl *this)

{
  Coroutine<bool> *this_00;
  PromiseAwaiter<unsigned_long> *__return_storage_ptr__;
  Promise<unsigned_long> *promise;
  PromiseArenaMember *pPVar1;
  long *plVar2;
  HttpInputStreamImpl *this_01;
  long lVar3;
  SourceLocation location;
  undefined8 node;
  bool bVar4;
  coroutine_handle<void> coroutine;
  FixVoid<bool> *value;
  long in_RSI;
  int iVar5;
  undefined **this_02;
  undefined1 local_68 [56];
  
  coroutine._M_fr_ptr = operator_new(0x628);
  *(code **)coroutine._M_fr_ptr = awaitNextMessage;
  *(code **)((long)coroutine._M_fr_ptr + 8) = awaitNextMessage;
  this_00 = (Coroutine<bool> *)((long)coroutine._M_fr_ptr + 0x10);
  *(long *)((long)coroutine._M_fr_ptr + 0x610) = in_RSI;
  local_68._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  local_68._8_8_ = "awaitNextMessage";
  local_68._16_8_ = (_func_int **)0x15000005d2;
  this_02 = &PTR_destroy_00643690;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_00643690;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_006436d8;
  local_68._24_8_ = (long)coroutine._M_fr_ptr + 0x98;
  location.function = "awaitNextMessage";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x5d2;
  location.columnNumber = 0x15;
  kj::_::CoroutineBase::CoroutineBase
            ((CoroutineBase *)this_00,coroutine,(ExceptionOrValue *)local_68._24_8_,location);
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_00643690;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_006436d8;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x98) = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x230) = 0;
  (this->super_HttpInputStream)._vptr_HttpInputStream = (_func_int **)this_00;
  local_68._48_8_ = this;
  if (*(char *)(in_RSI + 0xa8) == '\0') {
    if (*(long *)(in_RSI + 0xe0) != 0) {
      *(char **)((long)coroutine._M_fr_ptr + 0x5e0) =
           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
      ;
      *(char **)((long)coroutine._M_fr_ptr + 0x5e8) = "awaitNextMessage";
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x5f0) = 0x13000005e1;
      Promise<void>::fork((Promise<void> *)((long)coroutine._M_fr_ptr + 0x5f8));
      kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)local_68);
      pPVar1 = *(PromiseArenaMember **)(in_RSI + 0xe8);
      *(undefined8 *)(in_RSI + 0xe8) = local_68._0_8_;
      local_68._0_8_ = (PromiseArenaMember *)0x0;
      if (pPVar1 != (PromiseArenaMember *)0x0) {
        kj::_::PromiseDisposer::dispose(pPVar1);
      }
      node = local_68._0_8_;
      if ((PromiseArenaMember *)local_68._0_8_ != (PromiseArenaMember *)0x0) {
        local_68._0_8_ = (PromiseArenaMember *)0x0;
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
      }
      kj::_::ForkedPromiseAwaiter<void>::ForkedPromiseAwaiter
                ((ForkedPromiseAwaiter<void> *)((long)coroutine._M_fr_ptr + 0x238),
                 (ForkedPromise<void> *)((long)coroutine._M_fr_ptr + 0x5f8));
      *(undefined1 *)((long)coroutine._M_fr_ptr + 0x620) = 0;
      this_02 = (undefined **)((long)coroutine._M_fr_ptr + 0x268);
      bVar4 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                        ((PromiseAwaiterBase *)this_02,(CoroutineBase *)this_00);
      if (bVar4) {
        return (Promise<bool>)(PromiseNode *)local_68._48_8_;
      }
      kj::_::PromiseAwaiter<void>::await_resume((PromiseAwaiter<void> *)this_02);
      if (*(char *)((long)coroutine._M_fr_ptr + 0x280) == '\x01') {
        Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0x288));
      }
      kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)this_02);
      kj::_::ForkBranchBase::~ForkBranchBase((ForkBranchBase *)((long)coroutine._M_fr_ptr + 0x238));
      plVar2 = *(long **)((long)coroutine._M_fr_ptr + 0x600);
      if (plVar2 != (long *)0x0) {
        *(undefined8 *)((long)coroutine._M_fr_ptr + 0x600) = 0;
        (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0x5f8))
                  (*(undefined8 **)((long)coroutine._M_fr_ptr + 0x5f8),
                   (long)plVar2 + *(long *)(*plVar2 + -0x10));
      }
    }
    __return_storage_ptr__ = (PromiseAwaiter<unsigned_long> *)((long)coroutine._M_fr_ptr + 0x420);
    promise = (Promise<unsigned_long> *)((long)coroutine._M_fr_ptr + 0x608);
    local_68._32_8_ = (long)coroutine._M_fr_ptr + 0x621;
    value = (FixVoid<bool> *)((long)coroutine._M_fr_ptr + 0x622);
    local_68._40_8_ = (long)coroutine._M_fr_ptr + 0x440;
    do {
      *(undefined ***)((long)coroutine._M_fr_ptr + 0x618) = this_02;
      this_01 = *(HttpInputStreamImpl **)((long)coroutine._M_fr_ptr + 0x610);
      snarfBufferedLineBreak(this_01);
      if ((this_01->lineBreakBeforeNextHeader == false) && ((this_01->leftover).size_ != 0))
      goto LAB_003a6d4b;
      lVar3 = *(long *)((long)coroutine._M_fr_ptr + 0x610);
      (**(code **)(**(long **)(lVar3 + 0x10) + 8))
                (promise,*(long **)(lVar3 + 0x10),*(undefined8 *)(lVar3 + 0x18),1,
                 *(undefined8 *)(lVar3 + 0x20));
      co_await<unsigned_long>(__return_storage_ptr__,promise);
      *(undefined1 *)((long)coroutine._M_fr_ptr + 0x620) = 1;
      bVar4 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                        ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
      if (bVar4) {
        return (Promise<bool>)(PromiseNode *)local_68._48_8_;
      }
      this_02 = (undefined **)
                kj::_::PromiseAwaiter<unsigned_long>::await_resume(__return_storage_ptr__);
      if (*(char *)((long)coroutine._M_fr_ptr + 0x438) == '\x01') {
        Exception::~Exception((Exception *)local_68._40_8_);
      }
      kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)__return_storage_ptr__);
      pPVar1 = &((promise->super_PromiseBase).node.ptr)->super_PromiseArenaMember;
      if (pPVar1 != (PromiseArenaMember *)0x0) {
        (promise->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
        kj::_::PromiseDisposer::dispose(pPVar1);
      }
      if ((PromiseAwaiter<void> *)this_02 == (PromiseAwaiter<void> *)0x0) {
        *(FixVoid<bool> *)(_func_int ***)local_68._32_8_ = false;
        iVar5 = 3;
        kj::_::Coroutine<bool>::fulfill(this_00,(FixVoid<bool> *)local_68._32_8_);
      }
      else {
        lVar3 = *(long *)((long)coroutine._M_fr_ptr + 0x610);
        *(undefined8 *)(lVar3 + 0x38) = *(undefined8 *)(lVar3 + 0x18);
        *(undefined ***)(lVar3 + 0x40) = this_02;
        iVar5 = 0;
      }
    } while (iVar5 == 0);
    if (iVar5 != 3) {
      if ((((Maybe<kj::Exception> *)local_68._24_8_)->ptr).isSet == true) {
        Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0xa0));
      }
      kj::_::CoroutineBase::~CoroutineBase((CoroutineBase *)this_00);
      operator_delete(coroutine._M_fr_ptr,0x628);
      return (Promise<bool>)(PromiseNode *)local_68._48_8_;
    }
  }
  else {
    value = (FixVoid<bool> *)((long)coroutine._M_fr_ptr + 0x623);
LAB_003a6d4b:
    *value = true;
    kj::_::Coroutine<bool>::fulfill(this_00,value);
  }
  *(undefined8 *)coroutine._M_fr_ptr = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x620) = 2;
  return (Promise<bool>)(PromiseNode *)local_68._48_8_;
}

Assistant:

kj::Promise<bool> awaitNextMessage() override {
    // Waits until more data is available, but doesn't consume it. Returns false on EOF.
    //
    // Used on the server after a request is handled, to check for pipelined requests.
    //
    // Used on the client to detect when idle connections are closed from the server end. (In this
    // case, the promise always returns false or is canceled.)

    if (resumingRequest != kj::none) {
      // We're resuming a request, so report that we have a message.
      co_return true;
    }

    if (onMessageDone != kj::none) {
      // We're still working on reading the previous body.
      auto fork = messageReadQueue.fork();
      messageReadQueue = fork.addBranch();
      co_await fork;
    }

    for (;;) {
      snarfBufferedLineBreak();

      if (!lineBreakBeforeNextHeader && leftover != nullptr) {
        co_return true;
      }

      auto amount = co_await inner.tryRead(headerBuffer.begin(), 1, headerBuffer.size());
      if (amount == 0) {
        co_return false;
      }

      leftover = headerBuffer.first(amount);
    }
  }